

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::addVec
          (HighsSparseMatrix *this,HighsInt num_nz,HighsInt *index,double *value,double multiple)

{
  int iVar1;
  iterator iVar2;
  iterator __position;
  long lVar3;
  int local_4c;
  vector<int,std::allocator<int>> *local_48;
  double local_40;
  double local_38;
  
  iVar1 = (&this->num_col_)[this->format_ != kColwise];
  local_40 = multiple;
  if (0 < num_nz) {
    local_48 = (vector<int,std::allocator<int>> *)&this->index_;
    lVar3 = 0;
    do {
      iVar2._M_current =
           (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_48,iVar2,(int *)((long)index + lVar3));
      }
      else {
        *iVar2._M_current = *(int *)((long)index + lVar3);
        (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar2._M_current + 1;
      }
      local_38 = *(double *)((long)value + lVar3 * 2) * local_40;
      __position._M_current =
           (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->value_,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar3 = lVar3 + 4;
    } while ((ulong)(uint)num_nz << 2 != lVar3);
  }
  local_4c = num_nz + (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar1];
  iVar2._M_current =
       (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->start_,iVar2,&local_4c);
  }
  else {
    *iVar2._M_current = local_4c;
    (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  if (this->format_ == kColwise) {
    this->num_col_ = this->num_col_ + 1;
  }
  else {
    this->num_row_ = this->num_row_ + 1;
  }
  return;
}

Assistant:

void HighsSparseMatrix::addVec(const HighsInt num_nz, const HighsInt* index,
                               const double* value, const double multiple) {
  HighsInt num_vec = 0;
  if (this->isColwise()) {
    num_vec = this->num_col_;
  } else {
    num_vec = this->num_row_;
  }
  assert((int)this->start_.size() == num_vec + 1);
  assert((int)this->index_.size() == this->numNz());
  assert((int)this->value_.size() == this->numNz());
  for (HighsInt iEl = 0; iEl < num_nz; iEl++) {
    this->index_.push_back(index[iEl]);
    this->value_.push_back(multiple * value[iEl]);
  }
  this->start_.push_back(this->start_[num_vec] + num_nz);
  if (this->isColwise()) {
    this->num_col_++;
  } else {
    this->num_row_++;
  }
}